

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool cf_ssl_is_alive(Curl_cfilter *cf,Curl_easy *data,_Bool *input_pending)

{
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  int result;
  cf_call_data save;
  _Bool *input_pending_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
  *(Curl_easy **)((long)cf->ctx + 0x38) = data;
  iVar3 = (*Curl_ssl->check_cxn)(cf,data);
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
  if (iVar3 < 1) {
    if (iVar3 == 0) {
      *input_pending = false;
      cf_local._7_1_ = false;
    }
    else {
      if (cf->next == (Curl_cfilter *)0x0) {
        _Var2 = false;
      }
      else {
        _Var2 = (*cf->next->cft->is_alive)(cf->next,data,input_pending);
      }
      cf_local._7_1_ = _Var2 != false;
    }
  }
  else {
    *input_pending = true;
    cf_local._7_1_ = true;
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_ssl_is_alive(struct Curl_cfilter *cf, struct Curl_easy *data,
                            bool *input_pending)
{
  struct cf_call_data save;
  int result;
  /*
   * This function tries to determine connection status.
   *
   * Return codes:
   *     1 means the connection is still in place
   *     0 means the connection has been closed
   *    -1 means the connection status is unknown
   */
  CF_DATA_SAVE(save, cf, data);
  result = Curl_ssl->check_cxn(cf, data);
  CF_DATA_RESTORE(cf, save);
  if(result > 0) {
    *input_pending = TRUE;
    return TRUE;
  }
  if(result == 0) {
    *input_pending = FALSE;
    return FALSE;
  }
  /* ssl backend does not know */
  return cf->next ?
    cf->next->cft->is_alive(cf->next, data, input_pending) :
    FALSE; /* pessimistic in absence of data */
}